

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

R2Rect * __thiscall S2PaddedCell::middle(S2PaddedCell *this)

{
  VType *pVVar1;
  uint uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  S2LogMessage SStack_18;
  
  dVar4 = (this->middle_).bounds_[0].bounds_.c_[0];
  pVVar1 = (this->middle_).bounds_[0].bounds_.c_ + 1;
  if (dVar4 < *pVVar1 || dVar4 == *pVVar1) {
LAB_002037e8:
    return &this->middle_;
  }
  iVar3 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  uVar2 = iVar3 + this->ij_lo_[0] * 2;
  if (uVar2 < 0x80000001) {
    dVar4 = (double)uVar2 * 4.656612873077393e-10;
    if (0.5 <= dVar4) {
      dVar4 = dVar4 * 4.0 * dVar4 + -1.0;
    }
    else {
      dVar4 = (1.0 - dVar4) * -4.0 * (1.0 - dVar4) + 1.0;
    }
    uVar2 = iVar3 + this->ij_lo_[1] * 2;
    if (uVar2 < 0x80000001) {
      dVar6 = (double)uVar2 * 4.656612873077393e-10;
      if (0.5 <= dVar6) {
        dVar6 = dVar6 * 4.0 * dVar6 + -1.0;
      }
      else {
        dVar6 = (1.0 - dVar6) * -4.0 * (1.0 - dVar6) + 1.0;
      }
      dVar5 = this->padding_;
      dVar7 = dVar4 * 0.3333333333333333 - dVar5;
      dVar4 = dVar4 * 0.3333333333333333 + dVar5;
      dVar8 = dVar6 * 0.3333333333333333 - dVar5;
      dVar5 = dVar6 * 0.3333333333333333 + dVar5;
      if (dVar4 < dVar7 != dVar8 <= dVar5) {
        (this->middle_).bounds_[0].bounds_.c_[0] = dVar7;
        (this->middle_).bounds_[0].bounds_.c_[1] = dVar4;
        (this->middle_).bounds_[1].bounds_.c_[0] = dVar8;
        (this->middle_).bounds_[1].bounds_.c_[1] = dVar5;
        goto LAB_002037e8;
      }
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
                 ,0xac,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: is_valid() ",0x19);
    }
    else {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x153,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: (si) <= (kMaxSiTi) ",0x21);
    }
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
               ,0x153,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (si) <= (kMaxSiTi) ",0x21);
  }
  abort();
}

Assistant:

S2Point S2PaddedCell::GetCenter() const {
  int ij_size = S2CellId::GetSizeIJ(level_);
  unsigned int si = 2 * ij_lo_[0] + ij_size;
  unsigned int ti = 2 * ij_lo_[1] + ij_size;
  return S2::FaceSiTitoXYZ(id_.face(), si, ti).Normalize();
}